

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

bool __thiscall
diligent_spirv_cross::CompilerGLSL::to_trivial_mix_op
          (CompilerGLSL *this,SPIRType *type,string *op,uint32_t left,uint32_t right,uint32_t lerp)

{
  double dVar1;
  bool bVar2;
  SPIRConstant *pSVar3;
  SPIRConstant *pSVar4;
  SPIRType *pSVar5;
  SPIRType *type_00;
  uint32_t row;
  ulong uVar6;
  float fVar7;
  string local_50;
  
  pSVar3 = Compiler::maybe_get<diligent_spirv_cross::SPIRConstant>(&this->super_Compiler,left);
  pSVar4 = Compiler::maybe_get<diligent_spirv_cross::SPIRConstant>(&this->super_Compiler,right);
  pSVar5 = Compiler::expression_type(&this->super_Compiler,lerp);
  if (((pSVar4 != (SPIRConstant *)0x0 && pSVar3 != (SPIRConstant *)0x0) &&
      (pSVar3->specialization == false)) && (pSVar4->specialization == false)) {
    type_00 = Compiler::get<diligent_spirv_cross::SPIRType>
                        (&this->super_Compiler,*(uint32_t *)&(pSVar3->super_IVariant).field_0xc);
    if (pSVar5->basetype != Boolean) {
      return false;
    }
    if (type_00->basetype == Struct) {
      return false;
    }
    bVar2 = Compiler::is_array(&this->super_Compiler,type_00);
    if (!bVar2) {
      if ((this->backend).use_constructor_splatting == false) {
        if (type_00->vecsize != pSVar5->vecsize) {
          return false;
        }
        if (1 < type_00->columns) {
          return false;
        }
      }
      else if (1 < type_00->columns) {
        return false;
      }
      bVar2 = true;
      for (uVar6 = 0; (bVar2 && (uVar6 < type_00->vecsize)); uVar6 = uVar6 + 1) {
        bVar2 = false;
        switch(type->basetype) {
        case Short:
        case UShort:
          if (*(short *)((pSVar3->m).c[0].r + uVar6) == 0) {
            bVar2 = *(short *)((pSVar4->m).c[0].r + uVar6) == 1;
          }
          else {
LAB_0062f545:
            bVar2 = false;
          }
          break;
        case Int:
        case UInt:
          if ((pSVar3->m).c[0].r[uVar6].u32 != 0) goto LAB_0062f545;
          bVar2 = (pSVar4->m).c[0].r[uVar6].u32 == 1;
          break;
        case Int64:
        case UInt64:
          if ((pSVar3->m).c[0].r[uVar6].u64 != 0) goto LAB_0062f545;
          bVar2 = (pSVar4->m).c[0].r[uVar6].u64 == 1;
          break;
        case Half:
          fVar7 = SPIRConstant::f16_to_f32(*(uint16_t *)((pSVar3->m).c[0].r + uVar6));
          if ((fVar7 != 0.0) || (NAN(fVar7))) {
            bVar2 = false;
          }
          else {
            fVar7 = SPIRConstant::f16_to_f32(*(uint16_t *)((pSVar4->m).c[0].r + uVar6));
            bVar2 = fVar7 == 1.0;
          }
          break;
        case Float:
          fVar7 = (pSVar3->m).c[0].r[uVar6].f32;
          if ((fVar7 != 0.0) || (NAN(fVar7))) goto LAB_0062f545;
          bVar2 = (pSVar4->m).c[0].r[uVar6].f32 == 1.0;
          break;
        case Double:
          dVar1 = (pSVar3->m).c[0].r[uVar6].f64;
          if ((dVar1 != (double)(tSamplePos)0x0) || (NAN(dVar1))) goto LAB_0062f545;
          bVar2 = (pSVar4->m).c[0].r[uVar6].f64 == 1.0;
        }
      }
      if (bVar2) {
        type_to_glsl_constructor_abi_cxx11_(&local_50,this,type);
        ::std::__cxx11::string::operator=((string *)op,(string *)&local_50);
        ::std::__cxx11::string::~string((string *)&local_50);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool CompilerGLSL::to_trivial_mix_op(const SPIRType &type, string &op, uint32_t left, uint32_t right, uint32_t lerp)
{
	auto *cleft = maybe_get<SPIRConstant>(left);
	auto *cright = maybe_get<SPIRConstant>(right);
	auto &lerptype = expression_type(lerp);

	// If our targets aren't constants, we cannot use construction.
	if (!cleft || !cright)
		return false;

	// If our targets are spec constants, we cannot use construction.
	if (cleft->specialization || cright->specialization)
		return false;

	auto &value_type = get<SPIRType>(cleft->constant_type);

	if (lerptype.basetype != SPIRType::Boolean)
		return false;
	if (value_type.basetype == SPIRType::Struct || is_array(value_type))
		return false;
	if (!backend.use_constructor_splatting && value_type.vecsize != lerptype.vecsize)
		return false;

	// Only valid way in SPIR-V 1.4 to use matrices in select is a scalar select.
	// matrix(scalar) constructor fills in diagnonals, so gets messy very quickly.
	// Just avoid this case.
	if (value_type.columns > 1)
		return false;

	// If our bool selects between 0 and 1, we can cast from bool instead, making our trivial constructor.
	bool ret = true;
	for (uint32_t row = 0; ret && row < value_type.vecsize; row++)
	{
		switch (type.basetype)
		{
		case SPIRType::Short:
		case SPIRType::UShort:
			ret = cleft->scalar_u16(0, row) == 0 && cright->scalar_u16(0, row) == 1;
			break;

		case SPIRType::Int:
		case SPIRType::UInt:
			ret = cleft->scalar(0, row) == 0 && cright->scalar(0, row) == 1;
			break;

		case SPIRType::Half:
			ret = cleft->scalar_f16(0, row) == 0.0f && cright->scalar_f16(0, row) == 1.0f;
			break;

		case SPIRType::Float:
			ret = cleft->scalar_f32(0, row) == 0.0f && cright->scalar_f32(0, row) == 1.0f;
			break;

		case SPIRType::Double:
			ret = cleft->scalar_f64(0, row) == 0.0 && cright->scalar_f64(0, row) == 1.0;
			break;

		case SPIRType::Int64:
		case SPIRType::UInt64:
			ret = cleft->scalar_u64(0, row) == 0 && cright->scalar_u64(0, row) == 1;
			break;

		default:
			ret = false;
			break;
		}
	}

	if (ret)
		op = type_to_glsl_constructor(type);
	return ret;
}